

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall
MipsParser::parseMacroParameters(MipsParser *this,Parser *parser,MipsMacroDefinition *macro)

{
  anon_struct_40_4_e71670ea_for_secondary *paVar1;
  byte bVar2;
  bool bVar3;
  Token *pTVar4;
  MipsParser *dest;
  TokenType type;
  MipsParser *this_00;
  byte *pbVar5;
  
  pbVar5 = (byte *)macro->args;
  bVar2 = *pbVar5;
  if (bVar2 != 0) {
    this_00 = this;
    do {
      pbVar5 = pbVar5 + 1;
      if (bVar2 < 0x53) {
        if (bVar2 < 0x2c) {
          type = LParen;
          if (bVar2 != 0x28) {
            if (bVar2 != 0x29) {
              return false;
            }
            type = RParen;
          }
        }
        else {
          if (bVar2 != 0x2c) {
            paVar1 = &(this->immediate).secondary;
            if (bVar2 != 0x49) {
              return false;
            }
            goto LAB_00169a9d;
          }
          type = Comma;
        }
        this_00 = (MipsParser *)parser;
        bVar3 = Parser::matchToken(parser,type,false);
        if (!bVar3) {
          return false;
        }
      }
      else {
        if (bVar2 < 0x69) {
          if (bVar2 != 0x53) {
            dest = (MipsParser *)&(this->registers).grd;
            if (bVar2 != 100) {
              return false;
            }
            goto LAB_00169a76;
          }
          bVar3 = parseFpuRegister(this_00,parser,&(this->registers).frs);
        }
        else {
          paVar1 = (anon_struct_40_4_e71670ea_for_secondary *)&(this->immediate).primary;
          if (bVar2 == 0x69) {
LAB_00169a9d:
            bVar3 = parseImmediate(this_00,parser,&paVar1->expression);
          }
          else {
            dest = this;
            if ((bVar2 != 0x73) && (dest = (MipsParser *)&(this->registers).grt, bVar2 != 0x74)) {
              return false;
            }
LAB_00169a76:
            bVar3 = parseRegister(this_00,parser,(MipsRegisterValue *)dest);
          }
        }
        if (bVar3 == false) {
          return false;
        }
      }
      bVar2 = *pbVar5;
    } while (bVar2 != 0);
  }
  bVar3 = false;
  pTVar4 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar4->type != LParen) {
    pTVar4 = Tokenizer::nextToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    bVar3 = pTVar4->type == Separator;
  }
  return bVar3;
}

Assistant:

bool MipsParser::parseMacroParameters(Parser& parser, const MipsMacroDefinition& macro)
{
	const char* encoding = macro.args;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'S':	// register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			break;
		case 'I':	// secondary immediate
			CHECK(parseImmediate(parser,immediate.secondary.expression));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	// lw rx,imm is a prefix of lw rx,imm(ry)
	if (parser.peekToken().type == TokenType::LParen)
		return false;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}